

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O1

void __thiscall Nes_Apu::irq_changed(Nes_Apu *this)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (this->dmc).next_irq;
  lVar2 = this->next_irq;
  if (lVar1 < this->next_irq) {
    lVar2 = lVar1;
  }
  lVar1 = 0;
  if (this->irq_flag == false && (this->dmc).irq_flag == false) {
    lVar1 = lVar2;
  }
  if (lVar1 != this->earliest_irq_) {
    this->earliest_irq_ = lVar1;
    if (this->irq_notifier_ != (_func_void_void_ptr *)0x0) {
      (*this->irq_notifier_)(this->irq_data);
      return;
    }
  }
  return;
}

Assistant:

void Nes_Apu::irq_changed()
{
	cpu_time_t new_irq = dmc.next_irq;
	if ( dmc.irq_flag | irq_flag ) {
		new_irq = 0;
	}
	else if ( new_irq > next_irq ) {
		new_irq = next_irq;
	}
	
	if ( new_irq != earliest_irq_ ) {
		earliest_irq_ = new_irq;
		if ( irq_notifier_ )
			irq_notifier_( irq_data );
	}
}